

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall
CLI::Validator::Validator
          (Validator *this,string *validator_desc,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *func)

{
  anon_class_32_1_5ff8519c aStack_38;
  
  ::std::__cxx11::string::string((string *)&aStack_38,(string *)validator_desc);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string,std::function<std::__cxx11::string(std::__cxx11::string&)>)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,&aStack_38);
  ::std::__cxx11::string::~string((string *)&aStack_38);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->func_,func);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

Validator(std::string validator_desc, std::function<std::string(std::string &)> func)
        : desc_function_([validator_desc]() { return validator_desc; }), func_(std::move(func)) {}